

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_geom.c
# Opt level: O3

REF_STATUS ref_geom_constrain_all(REF_GRID ref_grid)

{
  REF_NODE pRVar1;
  int iVar2;
  uint uVar3;
  long lVar4;
  
  pRVar1 = ref_grid->node;
  iVar2 = pRVar1->max;
  if (0 < iVar2) {
    lVar4 = 0;
    do {
      if (-1 < pRVar1->global[lVar4]) {
        uVar3 = ref_geom_constrain(ref_grid,(REF_INT)lVar4);
        if (uVar3 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                 0x5fe,"ref_geom_constrain_all",(ulong)uVar3,"constrain node");
          return uVar3;
        }
        iVar2 = pRVar1->max;
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 < iVar2);
  }
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_geom_constrain_all(REF_GRID ref_grid) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_INT node;
  each_ref_node_valid_node(ref_node, node) {
    RSS(ref_geom_constrain(ref_grid, node), "constrain node");
  }
  return REF_SUCCESS;
}